

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t value;
  sysbvm_tuple_t type;
  undefined1 local_80 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_d81886b1 gcFrame;
  sysbvm_astTupleSlotNamedAtPutNode_t **slotNamedNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x20);
  memset(local_80,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_80);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar2,
                  *(sysbvm_tuple_t *)(*arguments + 0x28));
  sVar3 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),
                     *(sysbvm_tuple_t *)(*arguments + 0x40));
  value = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar2,
                     *(sysbvm_tuple_t *)(*arguments + 0x38));
  type = sysbvm_astNode_getAnalyzedType(*(sysbvm_tuple_t *)(*arguments + 0x28));
  _Var1 = sysbvm_type_isPointerLikeType(type);
  if (_Var1) {
    sysbvm_functionBytecodeAssembler_refSlotAtPut
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),
               (sysbvm_tuple_t)gcFrameRecord.roots,sVar3,value);
  }
  else {
    sysbvm_functionBytecodeAssembler_slotAtPut
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),
               (sysbvm_tuple_t)gcFrameRecord.roots,sVar3,value);
  }
  sVar3 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),0x2f);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_80);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astTupleSlotNamedAtPutNode_t **slotNamedNode = (sysbvm_astTupleSlotNamedAtPutNode_t**)node;
    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t value;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.tuple = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*slotNamedNode)->tupleExpression);
    gcFrame.slot = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (*slotNamedNode)->boundSlot);
    gcFrame.value = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*slotNamedNode)->valueExpression);
    if(sysbvm_type_isPointerLikeType(sysbvm_astNode_getAnalyzedType((*slotNamedNode)->tupleExpression)))
        sysbvm_functionBytecodeAssembler_refSlotAtPut(context, (*compiler)->assembler, gcFrame.tuple, gcFrame.slot, gcFrame.value);
    else
        sysbvm_functionBytecodeAssembler_slotAtPut(context, (*compiler)->assembler, gcFrame.tuple, gcFrame.slot, gcFrame.value);

    gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}